

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O3

QString * __thiscall QHostAddress::toString(QString *__return_storage_ptr__,QHostAddress *this)

{
  char cVar1;
  QHostAddressPrivate *pQVar2;
  long in_FS_OFFSET;
  QStringBuilder<char16_t,_QString_&> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar2 = (this->d).d.ptr;
  cVar1 = pQVar2->protocol;
  if (cVar1 == '\x02') {
LAB_001ac4c4:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_001ac52a:
      __stack_chk_fail();
    }
    QIPAddressUtils::toString((QString *)__return_storage_ptr__,pQVar2->a);
  }
  else {
    if (cVar1 == '\x01') {
      QIPAddressUtils::toString((QString *)__return_storage_ptr__,(uchar *)&pQVar2->field_1);
      pQVar2 = (this->d).d.ptr;
      if ((pQVar2->scopeId).d.size != 0) {
        local_28.b = &pQVar2->scopeId;
        local_28.a = L'%';
        operator+=(__return_storage_ptr__,&local_28);
      }
    }
    else if (cVar1 == '\0') goto LAB_001ac4c4;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_001ac52a;
  }
  return __return_storage_ptr__;
}

Assistant:

QString QHostAddress::toString() const
{
    QString s;
    if (d->protocol == QHostAddress::IPv4Protocol
        || d->protocol == QHostAddress::AnyIPProtocol) {
        quint32 i = toIPv4Address();
        QIPAddressUtils::toString(s, i);
    } else if (d->protocol == QHostAddress::IPv6Protocol) {
        QIPAddressUtils::toString(s, d->a6.c);
        if (!d->scopeId.isEmpty())
            s += u'%' + d->scopeId;
    }
    return s;
}